

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O1

void __thiscall tinyusdz::usda::USDAReader::Impl::RegisterPrimIdxAssignCallback(Impl *this)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_28._8_8_ = 0;
  pcStack_10 = ::std::
               _Function_handler<long_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc:704:43)>
               ::_M_invoke;
  local_18 = ::std::
             _Function_handler<long_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc:704:43)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  ::std::function<long_(long)>::operator=
            (&(this->_parser)._prim_idx_assign_fun,(function<long_(long)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

inline bool hasOutputs(const std::string &str) {
  return startsWith(str, "outputs:");
}